

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O1

void __thiscall QBlitterPaintEngine::drawRects(QBlitterPaintEngine *this,QRect *rects,int rectCount)

{
  uint uVar1;
  uint uVar2;
  QBlitterPaintEnginePrivate *this_00;
  undefined8 uVar3;
  QPaintEngineState *pQVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  QPaintEngineState *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  uVar1 = (this_00->caps).capabillitiesState;
  if ((uVar1 == 0) ||
     ((uVar2 = (this_00->caps).drawRectMask, (uVar2 & uVar1) != 0 && ((uVar1 & ~uVar2) == 0)))) {
    if (0 < rectCount) {
      lVar9 = 0;
      do {
        uVar3 = *(undefined8 *)((long)&(rects->x1).m_i + lVar9);
        iVar5 = (int)uVar3;
        iVar6 = (int)((ulong)uVar3 >> 0x20);
        dVar7 = (double)iVar6;
        local_58._8_4_ = SUB84(dVar7,0);
        local_58._0_8_ = (double)iVar5;
        local_58._12_4_ = (int)((ulong)dVar7 >> 0x20);
        local_48 = (double)(((long)*(int *)((long)&(rects->x2).m_i + lVar9) - (long)iVar5) + 1);
        local_40 = (double)(((long)*(int *)((long)&(rects->y2).m_i + lVar9) - (long)iVar6) + 1);
        pQVar4 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.state;
        pQVar8 = pQVar4 + -2;
        if (pQVar4 == (QPaintEngineState *)0x0) {
          pQVar8 = (QPaintEngineState *)0x0;
        }
        QBlitterPaintEnginePrivate::fillRect
                  (this_00,(QRectF *)local_58,(QColor *)(*(long *)(pQVar8 + 0x12) + 8),false);
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(uint)rectCount << 4 != lVar9);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QRasterPaintEngine::drawRects(&this->super_QRasterPaintEngine,rects,rectCount);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEngine::drawRects(const QRect *rects, int rectCount)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterDrawRectMask()) {
        for (int i=0; i<rectCount; ++i)
            d->fillRect(rects[i], qbrush_color(state()->brush), false);
    } else {
        d->pmData->markRasterOverlay(rects, rectCount);
        QRasterPaintEngine::drawRects(rects, rectCount);
    }
}